

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

NumberFormat *
icu_63::NumberFormat::internalCreateInstance(Locale *loc,UNumberFormatStyle kind,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  int iVar3;
  UErrorCode local_4c;
  int32_t kLen;
  UErrorCode kvStatus;
  char cfKeyValue [32];
  UErrorCode *status_local;
  UNumberFormatStyle kind_local;
  Locale *loc_local;
  
  cfKeyValue._24_8_ = status;
  status_local._4_4_ = kind;
  if (kind == UNUM_CURRENCY) {
    memset(&kLen,0,0x20);
    local_4c = U_ZERO_ERROR;
    iVar2 = Locale::getKeywordValue(loc,"cf",(char *)&kLen,0x20,&local_4c);
    UVar1 = ::U_SUCCESS(local_4c);
    if (((UVar1 != '\0') && (0 < iVar2)) && (iVar3 = strcmp((char *)&kLen,"account"), iVar3 == 0)) {
      status_local._4_4_ = UNUM_CURRENCY_ACCOUNTING;
    }
  }
  UVar1 = haveService();
  if (UVar1 == '\0') {
    loc_local = (Locale *)makeInstance(loc,status_local._4_4_,(UErrorCode *)cfKeyValue._24_8_);
  }
  else {
    loc_local = (Locale *)
                ICULocaleService::get
                          (gService,loc,status_local._4_4_,(UErrorCode *)cfKeyValue._24_8_);
  }
  return (NumberFormat *)loc_local;
}

Assistant:

NumberFormat*
NumberFormat::internalCreateInstance(const Locale& loc, UNumberFormatStyle kind, UErrorCode& status) {
    if (kind == UNUM_CURRENCY) {
        char cfKeyValue[kKeyValueLenMax] = {0};
        UErrorCode kvStatus = U_ZERO_ERROR;
        int32_t kLen = loc.getKeywordValue("cf", cfKeyValue, kKeyValueLenMax, kvStatus);
        if (U_SUCCESS(kvStatus) && kLen > 0 && uprv_strcmp(cfKeyValue,"account")==0) {
            kind = UNUM_CURRENCY_ACCOUNTING;
        }
    }
#if !UCONFIG_NO_SERVICE
    if (haveService()) {
        return (NumberFormat*)gService->get(loc, kind, status);
    }
#endif
    return makeInstance(loc, kind, status);
}